

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_VD_bp(uchar *bp,VD_type type,uchar ver)

{
  uchar ver_local;
  VD_type type_local;
  uchar *bp_local;
  
  bp[1] = (uchar)type;
  bp[2] = 'C';
  bp[3] = 'D';
  bp[4] = '0';
  bp[5] = '0';
  bp[6] = '1';
  bp[7] = ver;
  return;
}

Assistant:

static void
set_VD_bp(unsigned char *bp, enum VD_type type, unsigned char ver)
{

	/* Volume Descriptor Type */
	bp[1] = (unsigned char)type;
	/* Standard Identifier */
	memcpy(bp + 2, "CD001", 5);
	/* Volume Descriptor Version */
	bp[7] = ver;
}